

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O3

void decode_fglrx_ioctl_54(fglrx_ioctl_54 *d)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk00 != 0) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx);
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk04 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk04: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk08 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk08: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk0c != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk10 != 0) || (!bVar2)) {
    fprintf(_stdout,"%sunk10: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_54(struct fglrx_ioctl_54 *d)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	mmt_log_cont_nl();
}